

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

void ssh1_channel_close_local(ssh1_channel *c,char *reason)

{
  ssh1_connection_state *psVar1;
  LogContext *ctx;
  char *ptr;
  char *pcVar2;
  Channel *pCVar3;
  char *local_50;
  char *msg;
  PacketProtocolLayer *ppl;
  ssh1_connection_state *s;
  char *reason_local;
  ssh1_channel *c_local;
  
  psVar1 = c->connlayer;
  ptr = chan_log_close_msg(c->chan);
  if (ptr != (char *)0x0) {
    ctx = (psVar1->ppl).logctx;
    pcVar2 = anon_var_dwarf_2471b + 10;
    if (reason == (char *)0x0) {
      local_50 = anon_var_dwarf_2471b + 10;
    }
    else {
      pcVar2 = " ";
      local_50 = reason;
    }
    pcVar2 = dupprintf("%s%s%s",ptr,pcVar2,local_50);
    logevent_and_free(ctx,pcVar2);
    safefree(ptr);
  }
  chan_free(c->chan);
  pCVar3 = zombiechan_new();
  c->chan = pCVar3;
  return;
}

Assistant:

static void ssh1_channel_close_local(struct ssh1_channel *c,
                                     const char *reason)
{
    struct ssh1_connection_state *s = c->connlayer;
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    char *msg = chan_log_close_msg(c->chan);

    if (msg != NULL) {
        ppl_logevent("%s%s%s", msg, reason ? " " : "", reason ? reason : "");
        sfree(msg);
    }

    chan_free(c->chan);
    c->chan = zombiechan_new();
}